

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O3

void duckdb::SetArrowFormat
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *child,LogicalType *type,
               ClientProperties *options,ClientContext *context)

{
  size_t *psVar1;
  ArrowSchema *pAVar2;
  ArrowSchema **ppAVar3;
  value_type pAVar4;
  iterator iVar5;
  size_type sVar6;
  DuckDBArrowSchemaHolder *pDVar7;
  ClientProperties *options_00;
  char cVar8;
  bool bVar9;
  PhysicalType PVar10;
  long *plVar11;
  char *pcVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  reference pvVar14;
  idx_t __val;
  long lVar15;
  const_reference pvVar16;
  NotImplementedException *this;
  undefined8 *puVar17;
  LogicalType *type_00;
  pointer __s;
  _List_node_base *p_Var18;
  reference pvVar19;
  reference ppAVar20;
  InternalException *this_00;
  long *plVar21;
  size_type sVar22;
  idx_t iVar23;
  ulong uVar24;
  ulong *puVar25;
  size_type *psVar26;
  char *pcVar27;
  LogicalType *type_01;
  size_type __n;
  ulong uVar28;
  char cVar29;
  undefined8 uVar30;
  vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true> *this_01;
  uint uVar31;
  uint8_t scale;
  string format;
  unique_ptr<char[],_std::default_delete<char>,_false> name_ptr;
  uint8_t width;
  string __str;
  string __str_2;
  string __str_1;
  byte local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  DuckDBArrowSchemaHolder *local_e0;
  byte local_d1;
  undefined1 local_d0 [32];
  ClientContext *local_b0;
  ClientProperties *local_a8;
  ArrowSchema *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  *local_78;
  char **local_70;
  long local_68;
  char *local_60 [2];
  string local_50;
  
  bVar9 = LogicalType::HasAlias(type);
  if ((bVar9) &&
     (((bVar9 = LogicalType::IsJSONType(type), !bVar9 ||
       (options->arrow_lossless_conversion == true)) &&
      (bVar9 = SetArrowExtension(root_holder,child,type,context), bVar9)))) {
    return;
  }
  switch(type->id_) {
  case SQLNULL:
    pcVar12 = "n";
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case UHUGEINT:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_01216514_caseD_2:
    bVar9 = SetArrowExtension(root_holder,child,type,context);
    if (bVar9) {
      return;
    }
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Unsupported Arrow type %s","");
    LogicalType::ToString_abi_cxx11_(&local_50,type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this,&local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    if (options->arrow_lossless_conversion == true) {
LAB_01216745:
      SetArrowExtension(root_holder,child,type,context);
      return;
    }
    pcVar12 = "b";
    break;
  case TINYINT:
    pcVar12 = "c";
    break;
  case SMALLINT:
    pcVar12 = "s";
    break;
  case INTEGER:
    pcVar12 = "i";
    break;
  case BIGINT:
    pcVar12 = "l";
    break;
  case DATE:
    pcVar12 = "tdD";
    break;
  case TIME:
    goto switchD_01216514_caseD_10;
  case TIMESTAMP_SEC:
    pcVar12 = "tss:";
    break;
  case TIMESTAMP_MS:
    pcVar12 = "tsm:";
    break;
  case TIMESTAMP:
    pcVar12 = "tsu:";
    break;
  case TIMESTAMP_NS:
    pcVar12 = "tsn:";
    break;
  case DECIMAL:
    local_e0 = root_holder;
    LogicalType::GetDecimalProperties(type,&local_d1,&local_121);
    uVar31 = 1;
    if (9 < local_d1) {
      uVar31 = 3 - (local_d1 < 100);
    }
    local_d0._0_8_ = (pointer)(local_d0 + 0x10);
    ::std::__cxx11::string::_M_construct((ulong)local_d0,(char)uVar31);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d0._0_8_,uVar31,(uint)local_d1);
    plVar11 = (long *)::std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,0x1f5c201);
    local_98 = &local_88;
    plVar21 = plVar11 + 2;
    if ((long *)*plVar11 == plVar21) {
      local_88 = *plVar21;
      lStack_80 = plVar11[3];
    }
    else {
      local_88 = *plVar21;
      local_98 = (long *)*plVar11;
    }
    local_90 = plVar11[1];
    *plVar11 = (long)plVar21;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar17 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
    paVar13 = &local_100.field_2;
    puVar25 = puVar17 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar25) {
      local_100.field_2._M_allocated_capacity = *puVar25;
      local_100.field_2._8_8_ = puVar17[3];
      local_100._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_100.field_2._M_allocated_capacity = *puVar25;
      local_100._M_dataplus._M_p = (pointer)*puVar17;
    }
    local_100._M_string_length = puVar17[1];
    *puVar17 = puVar25;
    puVar17[1] = 0;
    *(undefined1 *)(puVar17 + 2) = 0;
    uVar31 = 1;
    if (9 < local_121) {
      uVar31 = 3 - (local_121 < 100);
    }
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar31);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,uVar31,(uint)local_121);
    uVar30 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar13) {
      uVar30 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < (char *)(local_100._M_string_length + local_68)) {
      pcVar12 = (char *)0xf;
      if (local_70 != local_60) {
        pcVar12 = local_60[0];
      }
      if (pcVar12 < (char *)(local_100._M_string_length + local_68)) goto LAB_01216fea;
      puVar17 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_70,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
    }
    else {
LAB_01216fea:
      puVar17 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_70);
    }
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    psVar26 = puVar17 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar26) {
      local_120.field_2._M_allocated_capacity = *psVar26;
      local_120.field_2._8_8_ = puVar17[3];
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar26;
      local_120._M_dataplus._M_p = (pointer)*puVar17;
    }
    local_120._M_string_length = puVar17[1];
    *puVar17 = psVar26;
    puVar17[1] = 0;
    *(undefined1 *)psVar26 = 0;
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar13) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    pDVar7 = local_e0;
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if ((pointer)local_d0._0_8_ != (pointer)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_);
    }
    sVar6 = local_120._M_string_length;
    uVar28 = local_120._M_string_length + 1;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)operator_new__(uVar28);
    switchD_012e3010::default(paVar13,0,uVar28);
    if (sVar6 != 0) {
      sVar22 = 0;
      do {
        paVar13->_M_local_buf[sVar22] = local_120._M_dataplus._M_p[sVar22];
        sVar22 = sVar22 + 1;
      } while (sVar6 != sVar22);
    }
    paVar13->_M_local_buf[sVar6] = '\0';
    local_100._M_dataplus._M_p = (pointer)paVar13;
    ::std::
    vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
    ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
              ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                *)&pDVar7->owned_type_names,
               (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_100._M_dataplus._M_p);
    }
    pvVar14 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                        (&pDVar7->owned_type_names);
    child->format =
         (pvVar14->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
         super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    goto LAB_01217561;
  case FLOAT:
    pcVar12 = "f";
    break;
  case DOUBLE:
    pcVar12 = "g";
    break;
  case VARCHAR:
    goto switchD_01216514_caseD_19;
  case BLOB:
    goto switchD_01216514_caseD_1a;
  case INTERVAL:
    pcVar12 = "tin";
    break;
  case UTINYINT:
    pcVar12 = "C";
    break;
  case USMALLINT:
    pcVar12 = "S";
    break;
  case UINTEGER:
    pcVar12 = "I";
    break;
  case UBIGINT:
    pcVar12 = "L";
    break;
  case TIMESTAMP_TZ:
    ::std::operator+(&local_120,"tsu:",&options->time_zone);
    sVar6 = local_120._M_string_length;
    uVar28 = local_120._M_string_length + 1;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)operator_new__(uVar28);
    switchD_012e3010::default(paVar13,0,uVar28);
    if (sVar6 != 0) {
      sVar22 = 0;
      do {
        paVar13->_M_local_buf[sVar22] = local_120._M_dataplus._M_p[sVar22];
        sVar22 = sVar22 + 1;
      } while (sVar6 != sVar22);
    }
    paVar13->_M_local_buf[sVar6] = '\0';
    local_100._M_dataplus._M_p = (pointer)paVar13;
    ::std::
    vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
    ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
              ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                *)&root_holder->owned_type_names,
               (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_100._M_dataplus._M_p);
    }
    pvVar14 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                        (&root_holder->owned_type_names);
    child->format =
         (pvVar14->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
         super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    goto LAB_01217561;
  case TIME_TZ:
    if (options->arrow_lossless_conversion == true) goto LAB_01216745;
    goto switchD_01216514_caseD_10;
  case BIT:
    if (options->arrow_lossless_conversion == true) goto LAB_01216745;
    goto switchD_01216514_caseD_1a;
  case HUGEINT:
    if (options->arrow_lossless_conversion == true) goto LAB_01216745;
    pcVar12 = "d:38,0";
    break;
  case UUID:
    if (options->arrow_lossless_conversion == true) goto LAB_01216745;
    goto switchD_01216514_caseD_19;
  default:
    local_a8 = options;
    local_b0 = context;
    switch(type->id_) {
    case STRUCT:
      SetArrowStructFormat(root_holder,child,type,options,context,false);
      return;
    case LIST:
      bVar9 = options->arrow_offset_size == LARGE;
      pcVar12 = "+vl";
      if (bVar9) {
        pcVar12 = "+vL";
      }
      pcVar27 = "+l";
      if (bVar9) {
        pcVar27 = "+L";
      }
      if (options->arrow_use_list_view != false) {
        pcVar27 = pcVar12;
      }
      child->format = pcVar27;
      child->n_children = 1;
      p_Var18 = (_List_node_base *)operator_new(0x28);
      p_Var18[1]._M_next = (_List_node_base *)0x0;
      p_Var18[1]._M_prev = (_List_node_base *)0x0;
      p_Var18[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var18);
      psVar1 = &(root_holder->nested_children).
                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),1);
      p_Var18 = (_List_node_base *)operator_new(0x28);
      p_Var18[1]._M_next = (_List_node_base *)0x0;
      p_Var18[1]._M_prev = (_List_node_base *)0x0;
      p_Var18[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var18);
      psVar1 = &(root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var18 = (root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev;
      local_120._M_dataplus._M_p =
           (pointer)vector<ArrowSchema,_true>::operator[]
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      iVar5._M_current = (ArrowSchema **)p_Var18[1]._M_prev;
      if ((_List_node_base *)iVar5._M_current == p_Var18[2]._M_next) {
        ::std::vector<ArrowSchema*,std::allocator<ArrowSchema*>>::_M_realloc_insert<ArrowSchema*>
                  ((vector<ArrowSchema*,std::allocator<ArrowSchema*>> *)(p_Var18 + 1),iVar5,
                   (ArrowSchema **)&local_120);
      }
      else {
        *iVar5._M_current = (ArrowSchema *)local_120._M_dataplus._M_p;
        p_Var18[1]._M_prev = (_List_node_base *)&(p_Var18[1]._M_prev)->_M_prev;
      }
      pvVar19 = vector<ArrowSchema,_true>::operator[]
                          ((vector<ArrowSchema,_true> *)
                           ((root_holder->nested_children).
                            super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,anon_var_dwarf_4ed193b + 9);
      InitializeChild(pvVar19,root_holder,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      ppAVar20 = vector<ArrowSchema_*,_true>::operator[]
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      child->children = ppAVar20;
      (*ppAVar20)->name = "l";
      pAVar2 = *ppAVar20;
      type_00 = ListType::GetChildType(type);
      SetArrowFormat(root_holder,pAVar2,type_00,local_a8,context);
      return;
    case MAP:
      SetArrowMapFormat(root_holder,child,type,options,context);
      return;
    default:
      goto switchD_01216514_caseD_2;
    case ENUM:
      PVar10 = EnumType::GetPhysicalType(type);
      if (PVar10 == UINT8) {
        pcVar12 = "C";
      }
      else if (PVar10 == UINT32) {
        pcVar12 = "I";
      }
      else {
        if (PVar10 != UINT16) {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"Unsupported Enum Internal Type","");
          InternalException::InternalException(this_00,(string *)&local_120);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pcVar12 = "S";
      }
      child->format = pcVar12;
      p_Var18 = (_List_node_base *)operator_new(0x28);
      p_Var18[1]._M_next = (_List_node_base *)0x0;
      p_Var18[1]._M_prev = (_List_node_base *)0x0;
      p_Var18[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var18);
      psVar1 = &(root_holder->nested_children).
                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),1);
      p_Var18 = (_List_node_base *)operator_new(0x28);
      p_Var18[1]._M_next = (_List_node_base *)0x0;
      p_Var18[1]._M_prev = (_List_node_base *)0x0;
      p_Var18[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var18);
      psVar1 = &(root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var18 = (root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev;
      local_120._M_dataplus._M_p =
           (pointer)vector<ArrowSchema,_true>::operator[]
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      iVar5._M_current = (ArrowSchema **)p_Var18[1]._M_prev;
      if ((_List_node_base *)iVar5._M_current == p_Var18[2]._M_next) {
        ::std::vector<ArrowSchema*,std::allocator<ArrowSchema*>>::_M_realloc_insert<ArrowSchema*>
                  ((vector<ArrowSchema*,std::allocator<ArrowSchema*>> *)(p_Var18 + 1),iVar5,
                   (ArrowSchema **)&local_120);
      }
      else {
        *iVar5._M_current = (ArrowSchema *)local_120._M_dataplus._M_p;
        p_Var18[1]._M_prev = (_List_node_base *)&(p_Var18[1]._M_prev)->_M_prev;
      }
      pvVar19 = vector<ArrowSchema,_true>::operator[]
                          ((vector<ArrowSchema,_true> *)
                           ((root_holder->nested_children).
                            super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,anon_var_dwarf_4ed193b + 9);
      InitializeChild(pvVar19,root_holder,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      ppAVar20 = vector<ArrowSchema_*,_true>::operator[]
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      pAVar4 = *ppAVar20;
      child->dictionary = pAVar4;
      pAVar4->format = "u";
      return;
    case UNION:
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"+us:","");
      UnionType::CopyMemberTypes_abi_cxx11_
                ((child_list_t<LogicalType> *)local_d0,(UnionType *)type,type_01);
      lVar15 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                         (((long)(local_d0._8_8_ - local_d0._0_8_) >> 3) * 0x6db6db6db6db6db7);
      child->n_children = lVar15;
      p_Var18 = (_List_node_base *)operator_new(0x28);
      p_Var18[1]._M_next = (_List_node_base *)0x0;
      p_Var18[1]._M_prev = (_List_node_base *)0x0;
      p_Var18[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var18);
      psVar1 = &(root_holder->nested_children).
                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                 ((long)(local_d0._8_8_ - local_d0._0_8_) >> 3) * 0x6db6db6db6db6db7);
      p_Var18 = (_List_node_base *)operator_new(0x28);
      p_Var18[1]._M_next = (_List_node_base *)0x0;
      p_Var18[1]._M_prev = (_List_node_base *)0x0;
      p_Var18[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var18);
      psVar1 = &(root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>::resize
                ((vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_> *)
                 ((root_holder->nested_children_ptr).
                  super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                 ((long)(local_d0._8_8_ - local_d0._0_8_) >> 3) * 0x6db6db6db6db6db7);
      if (local_d0._8_8_ != local_d0._0_8_) {
        __n = 0;
        do {
          pvVar19 = vector<ArrowSchema,_true>::operator[]
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),__n);
          ppAVar20 = vector<ArrowSchema_*,_true>::operator[]
                               ((vector<ArrowSchema_*,_true> *)
                                ((root_holder->nested_children_ptr).
                                 super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                                 ._M_impl._M_node.super__List_node_base._M_prev + 1),__n);
          *ppAVar20 = pvVar19;
          __n = __n + 1;
        } while (__n < (ulong)(((long)(local_d0._8_8_ - local_d0._0_8_) >> 3) * 0x6db6db6db6db6db7))
        ;
      }
      ppAVar20 = vector<ArrowSchema_*,_true>::operator[]
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      child->children = ppAVar20;
      local_e0 = root_holder;
      local_a0 = child;
      if (local_d0._8_8_ != local_d0._0_8_) {
        paVar13 = &local_100.field_2;
        local_78 = (vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                    *)&root_holder->owned_type_names;
        uVar28 = 0;
        do {
          pAVar2 = local_a0->children[uVar28];
          local_100._M_dataplus._M_p = (pointer)paVar13;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100,anon_var_dwarf_4ed193b + 9);
          InitializeChild(pAVar2,local_e0,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != paVar13) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          pvVar16 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                  *)local_d0,uVar28);
          AddName((duckdb *)&local_100,&pvVar16->first);
          ::std::
          vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
          ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                    (local_78,(unique_ptr<char[],_std::default_delete<char>,_false> *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete__(local_100._M_dataplus._M_p);
          }
          pvVar14 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                              ((vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>
                                *)local_78);
          ppAVar3 = local_a0->children;
          ppAVar3[uVar28]->name =
               (pvVar14->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
          pAVar2 = ppAVar3[uVar28];
          pvVar16 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                  *)local_d0,uVar28);
          SetArrowFormat(local_e0,pAVar2,&pvVar16->second,local_a8,local_b0);
          cVar29 = '\x01';
          if (9 < uVar28) {
            uVar24 = uVar28;
            cVar8 = '\x04';
            do {
              cVar29 = cVar8;
              if (uVar24 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_01216c89;
              }
              if (uVar24 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_01216c89;
              }
              if (uVar24 < 10000) goto LAB_01216c89;
              bVar9 = 99999 < uVar24;
              uVar24 = uVar24 / 10000;
              cVar8 = cVar29 + '\x04';
            } while (bVar9);
            cVar29 = cVar29 + '\x01';
          }
LAB_01216c89:
          local_98 = &local_88;
          ::std::__cxx11::string::_M_construct((ulong)&local_98,cVar29);
          ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,(uint)local_90,uVar28)
          ;
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_98);
          puVar25 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_100.field_2._M_allocated_capacity = *puVar25;
            local_100.field_2._8_8_ = plVar11[3];
            local_100._M_dataplus._M_p = (pointer)paVar13;
          }
          else {
            local_100.field_2._M_allocated_capacity = *puVar25;
            local_100._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_100._M_string_length = plVar11[1];
          *plVar11 = (long)puVar25;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != paVar13) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 < (ulong)(((long)(local_d0._8_8_ - local_d0._0_8_) >> 3) *
                                 0x6db6db6db6db6db7));
      }
      ::std::__cxx11::string::pop_back();
      sVar6 = local_120._M_string_length;
      uVar28 = local_120._M_string_length + 1;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new__(uVar28);
      this_01 = &local_e0->owned_type_names;
      switchD_012e3010::default(paVar13,0,uVar28);
      pAVar2 = local_a0;
      if (sVar6 != 0) {
        sVar22 = 0;
        do {
          paVar13->_M_local_buf[sVar22] = local_120._M_dataplus._M_p[sVar22];
          sVar22 = sVar22 + 1;
        } while (sVar6 != sVar22);
      }
      paVar13->_M_local_buf[sVar6] = '\0';
      local_100._M_dataplus._M_p = (pointer)paVar13;
      ::std::
      vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
      ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                  *)this_01,(unique_ptr<char[],_std::default_delete<char>,_false> *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete__(local_100._M_dataplus._M_p);
      }
      pvVar14 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                          (this_01);
      pAVar2->format =
           (pvVar14->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
           super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)local_d0);
      break;
    case ARRAY:
      __val = ArrayType::GetSize(type);
      local_e0 = (DuckDBArrowSchemaHolder *)ArrayType::GetChildType(type);
      cVar29 = '\x01';
      if (9 < __val) {
        iVar23 = __val;
        cVar8 = '\x04';
        do {
          cVar29 = cVar8;
          if (iVar23 < 100) {
            cVar29 = cVar29 + -2;
            goto LAB_01217306;
          }
          if (iVar23 < 1000) {
            cVar29 = cVar29 + -1;
            goto LAB_01217306;
          }
          if (iVar23 < 10000) goto LAB_01217306;
          bVar9 = 99999 < iVar23;
          iVar23 = iVar23 / 10000;
          cVar8 = cVar29 + '\x04';
        } while (bVar9);
        cVar29 = cVar29 + '\x01';
      }
LAB_01217306:
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_100,cVar29);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (local_100._M_dataplus._M_p,(uint)local_100._M_string_length,__val);
      puVar17 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x1dd182d);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      psVar26 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar26) {
        local_120.field_2._M_allocated_capacity = *psVar26;
        local_120.field_2._8_8_ = puVar17[3];
      }
      else {
        local_120.field_2._M_allocated_capacity = *psVar26;
        local_120._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_120._M_string_length = puVar17[1];
      *puVar17 = psVar26;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      sVar6 = local_120._M_string_length;
      uVar28 = local_120._M_string_length + 1;
      __s = (pointer)operator_new__(uVar28);
      switchD_012e3010::default(__s,0,uVar28);
      if (sVar6 != 0) {
        sVar22 = 0;
        do {
          __s[sVar22] = local_120._M_dataplus._M_p[sVar22];
          sVar22 = sVar22 + 1;
        } while (sVar6 != sVar22);
      }
      __s[sVar6] = '\0';
      local_100._M_dataplus._M_p = __s;
      ::std::
      vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
      ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                  *)&root_holder->owned_type_names,
                 (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_100);
      if (local_100._M_dataplus._M_p != (pointer)0x0) {
        operator_delete__(local_100._M_dataplus._M_p);
      }
      pvVar14 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                          (&root_holder->owned_type_names);
      child->format =
           (pvVar14->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
           super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      child->n_children = 1;
      p_Var18 = (_List_node_base *)operator_new(0x28);
      p_Var18[1]._M_next = (_List_node_base *)0x0;
      p_Var18[1]._M_prev = (_List_node_base *)0x0;
      p_Var18[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var18);
      psVar1 = &(root_holder->nested_children).
                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),1);
      p_Var18 = (_List_node_base *)operator_new(0x28);
      p_Var18[1]._M_next = (_List_node_base *)0x0;
      p_Var18[1]._M_prev = (_List_node_base *)0x0;
      p_Var18[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var18);
      psVar1 = &(root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var18 = (root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev;
      local_100._M_dataplus._M_p =
           (pointer)vector<ArrowSchema,_true>::operator[]
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      iVar5._M_current = (ArrowSchema **)p_Var18[1]._M_prev;
      if ((_List_node_base *)iVar5._M_current == p_Var18[2]._M_next) {
        ::std::vector<ArrowSchema*,std::allocator<ArrowSchema*>>::_M_realloc_insert<ArrowSchema*>
                  ((vector<ArrowSchema*,std::allocator<ArrowSchema*>> *)(p_Var18 + 1),iVar5,
                   (ArrowSchema **)&local_100);
      }
      else {
        *iVar5._M_current = (ArrowSchema *)local_100._M_dataplus._M_p;
        p_Var18[1]._M_prev = (_List_node_base *)&(p_Var18[1]._M_prev)->_M_prev;
      }
      pvVar19 = vector<ArrowSchema,_true>::operator[]
                          ((vector<ArrowSchema,_true> *)
                           ((root_holder->nested_children).
                            super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      options_00 = local_a8;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,anon_var_dwarf_4ed193b + 9);
      InitializeChild(pvVar19,root_holder,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      ppAVar20 = vector<ArrowSchema_*,_true>::operator[]
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      child->children = ppAVar20;
      SetArrowFormat(root_holder,*ppAVar20,(LogicalType *)local_e0,options_00,local_b0);
    }
LAB_01217561:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p == &local_120.field_2) {
      return;
    }
    operator_delete(local_120._M_dataplus._M_p);
    return;
  }
LAB_01216ebb:
  child->format = pcVar12;
  return;
switchD_01216514_caseD_1a:
  if (options->arrow_offset_size == LARGE) {
    pcVar12 = "Z";
  }
  else {
    pcVar12 = "z";
  }
  goto LAB_01216ebb;
switchD_01216514_caseD_19:
  if (options->produce_arrow_string_view == true) {
    pcVar12 = "vu";
  }
  else if (options->arrow_offset_size == LARGE) {
    pcVar12 = "U";
  }
  else {
    pcVar12 = "u";
  }
  goto LAB_01216ebb;
switchD_01216514_caseD_10:
  pcVar12 = "ttu";
  goto LAB_01216ebb;
}

Assistant:

void SetArrowFormat(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &child, const LogicalType &type,
                    ClientProperties &options, ClientContext &context) {
	if (type.HasAlias()) {
		// If it is a json type, we only export it as json if arrow_lossless_conversion = True
		if (!(type.IsJSONType() && !options.arrow_lossless_conversion)) {
			// If the type has an alias, we check if it is an Arrow-Type extension
			if (SetArrowExtension(root_holder, child, type, context)) {
				return;
			}
		}
	}
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			child.format = "b";
		}
		break;
	case LogicalTypeId::TINYINT:
		child.format = "c";
		break;
	case LogicalTypeId::SMALLINT:
		child.format = "s";
		break;
	case LogicalTypeId::INTEGER:
		child.format = "i";
		break;
	case LogicalTypeId::BIGINT:
		child.format = "l";
		break;
	case LogicalTypeId::UTINYINT:
		child.format = "C";
		break;
	case LogicalTypeId::USMALLINT:
		child.format = "S";
		break;
	case LogicalTypeId::UINTEGER:
		child.format = "I";
		break;
	case LogicalTypeId::UBIGINT:
		child.format = "L";
		break;
	case LogicalTypeId::FLOAT:
		child.format = "f";
		break;
	case LogicalTypeId::HUGEINT: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			child.format = "d:38,0";
		}
		break;
	}
	case LogicalTypeId::DOUBLE:
		child.format = "g";
		break;
	case LogicalTypeId::UUID: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			if (options.produce_arrow_string_view) {
				child.format = "vu";
			} else {
				if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
					child.format = "U";
				} else {
					child.format = "u";
				}
			}
		}
		break;
	}
	case LogicalTypeId::VARCHAR:
		if (options.produce_arrow_string_view) {
			child.format = "vu";
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "U";
			} else {
				child.format = "u";
			}
		}
		break;
	case LogicalTypeId::DATE:
		child.format = "tdD";
		break;
	case LogicalTypeId::TIME_TZ: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			child.format = "ttu";
		}
		break;
	}
	case LogicalTypeId::TIME:
		child.format = "ttu";
		break;
	case LogicalTypeId::TIMESTAMP:
		child.format = "tsu:";
		break;
	case LogicalTypeId::TIMESTAMP_TZ: {
		string format = "tsu:" + options.time_zone;
		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();
		break;
	}
	case LogicalTypeId::TIMESTAMP_SEC:
		child.format = "tss:";
		break;
	case LogicalTypeId::TIMESTAMP_NS:
		child.format = "tsn:";
		break;
	case LogicalTypeId::TIMESTAMP_MS:
		child.format = "tsm:";
		break;
	case LogicalTypeId::INTERVAL:
		child.format = "tin";
		break;
	case LogicalTypeId::DECIMAL: {
		uint8_t width, scale;
		type.GetDecimalProperties(width, scale);
		string format = "d:" + to_string(width) + "," + to_string(scale);
		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();
		break;
	}
	case LogicalTypeId::SQLNULL: {
		child.format = "n";
		break;
	}
	case LogicalTypeId::BLOB:
		if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
			child.format = "Z";
		} else {
			child.format = "z";
		}
		break;
	case LogicalTypeId::BIT: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "Z";
			} else {
				child.format = "z";
			}
		}

		break;
	}
	case LogicalTypeId::LIST: {
		if (options.arrow_use_list_view) {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "+vL";
			} else {
				child.format = "+vl";
			}
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "+L";
			} else {
				child.format = "+l";
			}
		}
		child.n_children = 1;
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(1);
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().push_back(&root_holder.nested_children.back()[0]);
		InitializeChild(root_holder.nested_children.back()[0], root_holder);
		child.children = &root_holder.nested_children_ptr.back()[0];
		child.children[0]->name = "l";
		SetArrowFormat(root_holder, **child.children, ListType::GetChildType(type), options, context);
		break;
	}
	case LogicalTypeId::STRUCT: {
		SetArrowStructFormat(root_holder, child, type, options, context);
		break;
	}
	case LogicalTypeId::ARRAY: {
		auto array_size = ArrayType::GetSize(type);
		auto &child_type = ArrayType::GetChildType(type);
		auto format = "+w:" + to_string(array_size);
		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();

		child.n_children = 1;
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(1);
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().push_back(&root_holder.nested_children.back()[0]);
		InitializeChild(root_holder.nested_children.back()[0], root_holder);
		child.children = &root_holder.nested_children_ptr.back()[0];
		SetArrowFormat(root_holder, **child.children, child_type, options, context);
		break;
	}
	case LogicalTypeId::MAP: {
		SetArrowMapFormat(root_holder, child, type, options, context);
		break;
	}
	case LogicalTypeId::UNION: {
		std::string format = "+us:";

		auto &child_types = UnionType::CopyMemberTypes(type);
		child.n_children = NumericCast<int64_t>(child_types.size());
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(child_types.size());
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().resize(child_types.size());
		for (idx_t type_idx = 0; type_idx < child_types.size(); type_idx++) {
			root_holder.nested_children_ptr.back()[type_idx] = &root_holder.nested_children.back()[type_idx];
		}
		child.children = &root_holder.nested_children_ptr.back()[0];
		for (size_t type_idx = 0; type_idx < child_types.size(); type_idx++) {

			InitializeChild(*child.children[type_idx], root_holder);

			root_holder.owned_type_names.push_back(AddName(child_types[type_idx].first));

			child.children[type_idx]->name = root_holder.owned_type_names.back().get();
			SetArrowFormat(root_holder, *child.children[type_idx], child_types[type_idx].second, options, context);

			format += to_string(type_idx) + ",";
		}

		format.pop_back();

		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();

		break;
	}
	case LogicalTypeId::ENUM: {
		// TODO what do we do with pointer enums here?
		switch (EnumType::GetPhysicalType(type)) {
		case PhysicalType::UINT8:
			child.format = "C";
			break;
		case PhysicalType::UINT16:
			child.format = "S";
			break;
		case PhysicalType::UINT32:
			child.format = "I";
			break;
		default:
			throw InternalException("Unsupported Enum Internal Type");
		}
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(1);
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().push_back(&root_holder.nested_children.back()[0]);
		InitializeChild(root_holder.nested_children.back()[0], root_holder);
		child.dictionary = root_holder.nested_children_ptr.back()[0];
		child.dictionary->format = "u";
		break;
	}
	default: {
		// It is possible we can export this type as a registered extension
		auto success = SetArrowExtension(root_holder, child, type, context);
		if (!success) {
			throw NotImplementedException("Unsupported Arrow type %s", type.ToString());
		}
	}
	}
}